

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_line_ended_undo(Parser *this)

{
  size_t *psVar1;
  char cVar2;
  State *pSVar3;
  size_t sVar4;
  code *pcVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  byte bVar15;
  char msg [39];
  char local_98 [104];
  undefined4 local_30;
  undefined1 local_2c;
  undefined4 local_20;
  undefined1 local_1c;
  
  bVar15 = 0;
  if ((this->m_state->pos).super_LineCol.col != 1) {
    builtin_strncpy(local_98,"check failed: (m_state->pos.col == 1u)",0x27);
    if ((s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x76ae) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x76ae) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_98,0x27,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((this->m_state->pos).super_LineCol.line == 0) {
    builtin_strncpy(local_98,"check failed: (m_state->pos.line > 0u)",0x27);
    if ((s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x76af) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x76af) << 0x40,8);
    LVar7.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_98,0x27,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar3 = this->m_state;
  if ((pSVar3->pos).super_LineCol.offset <
      (pSVar3->line_contents).full.len - (pSVar3->line_contents).stripped.len) {
    pcVar12 = 
    "check failed: (m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len)"
    ;
    pcVar13 = local_98;
    for (lVar11 = 0xd; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(undefined8 *)pcVar13 = *(undefined8 *)pcVar12;
      pcVar12 = pcVar12 + ((ulong)bVar15 * -2 + 1) * 8;
      pcVar13 = pcVar13 + ((ulong)bVar15 * -2 + 1) * 8;
    }
    local_2c = 0;
    local_30 = 0x296e656c;
    if ((s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x76b0) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x76b0) << 0x40,8);
    LVar8.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar8.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_98,0x6d,LVar8,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar3 = this->m_state;
  sVar4 = (pSVar3->line_contents).stripped.len;
  uVar14 = (sVar4 - (pSVar3->line_contents).full.len) + (pSVar3->pos).super_LineCol.offset;
  (pSVar3->pos).super_LineCol.offset = uVar14;
  psVar1 = &(pSVar3->pos).super_LineCol.line;
  *psVar1 = *psVar1 - 1;
  (pSVar3->pos).super_LineCol.col = sVar4 + 1;
  if (uVar14 < (this->m_buf).len) {
    if ((this->m_buf).len <= uVar14) {
      if ((s_error_flags & 1) != 0) {
        bVar10 = is_debugger_attached();
        if (bVar10) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    cVar2 = (this->m_buf).str[uVar14];
    if ((cVar2 != '\n') && (cVar2 != '\r')) {
      pcVar12 = 
      "check failed: (m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == \'\\n\' || m_buf[m_state->pos.offset] == \'\\r\')"
      ;
      pcVar13 = local_98;
      for (lVar11 = 0xf; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(undefined8 *)pcVar13 = *(undefined8 *)pcVar12;
        pcVar12 = pcVar12 + ((ulong)bVar15 * -2 + 1) * 8;
        pcVar13 = pcVar13 + ((ulong)bVar15 * -2 + 1) * 8;
      }
      local_1c = 0;
      local_20 = 0x2927725c;
      if ((s_error_flags & 1) != 0) {
        bVar10 = is_debugger_attached();
        if (bVar10) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x76b7) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x76b7) << 0x40,8);
      LVar9.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar9.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_98,0x7d,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  uVar14 = (this->m_state->pos).super_LineCol.offset;
  if (uVar14 <= (this->m_buf).len) {
    pSVar3 = this->m_state;
    (pSVar3->line_contents).rem.str = (this->m_buf).str + uVar14;
    (pSVar3->line_contents).rem.len = 0;
    return;
  }
  if ((s_error_flags & 1) != 0) {
    bVar10 = is_debugger_attached();
    if (bVar10) {
      pcVar5 = (code *)swi(3);
      (*pcVar5)();
      return;
    }
  }
  handle_error(0x21a325,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x153a,"first >= 0 && first <= len");
}

Assistant:

void Parser::_line_ended_undo()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == 1u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.line > 0u);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    size_t delta = m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    _c4dbgpf("line[{}] undo ended! line {}-->{}, offset {}-->{}", m_state->pos.line, m_state->pos.line, m_state->pos.line - 1, m_state->pos.offset, m_state->pos.offset - delta);
    m_state->pos.offset -= delta;
    --m_state->pos.line;
    m_state->pos.col = m_state->line_contents.stripped.len + 1u;
    // don't forget to undo also the changes to the remainder of the line
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= m_buf.len || m_buf[m_state->pos.offset] == '\n' || m_buf[m_state->pos.offset] == '\r');
    m_state->line_contents.rem = m_buf.sub(m_state->pos.offset, 0);
}